

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isLevel3DLookupResultValid
               (ConstPixelBufferAccess *access,Sampler *sampler,TexLookupScaleMode scaleMode,
               IntLookupPrecision *prec,Vec3 *coord,IVec4 *result)

{
  bool bVar1;
  IVec4 *result_local;
  Vec3 *coord_local;
  IntLookupPrecision *prec_local;
  TexLookupScaleMode scaleMode_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *access_local;
  
  bVar1 = isNearestSampleResultValid<tcu::IntLookupPrecision,int>(access,sampler,prec,coord,result);
  return bVar1;
}

Assistant:

bool isLevel3DLookupResultValid (const ConstPixelBufferAccess&	access,
								 const Sampler&					sampler,
								 TexLookupScaleMode				scaleMode,
								 const IntLookupPrecision&		prec,
								 const Vec3&					coord,
								 const IVec4&					result)
{
	DE_ASSERT(sampler.minFilter == Sampler::NEAREST && sampler.magFilter == Sampler::NEAREST);
	DE_UNREF(scaleMode);
	return isNearestSampleResultValid(access, sampler, prec, coord, result);
}